

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aq_complexity.c
# Opt level: O2

void av1_caq_select_segment
               (AV1_COMP *cpi,MACROBLOCK *mb,BLOCK_SIZE bs,int mi_row,int mi_col,int projected_rate)

{
  uint8_t uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  SequenceHeader *pSVar5;
  _Bool _Var6;
  uint uVar7;
  int iVar8;
  long lVar9;
  uint uVar10;
  uint uVar11;
  ulong uVar12;
  uint8_t *__s;
  bool bVar13;
  double dVar14;
  double dVar15;
  int local_40;
  
  _Var6 = is_frame_aq_enabled(cpi);
  if ((_Var6) && (iVar2 = (cpi->rc).sb64_target_rate, 0xff < iVar2)) {
    pSVar5 = (cpi->common).seq_params;
    uVar1 = pSVar5->monochrome;
    iVar3 = (cpi->common).mi_params.mi_cols;
    uVar10 = iVar3 - mi_col;
    if ((int)(uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"[bs]
        <= (int)uVar10) {
      uVar10 = (uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                     [bs];
    }
    uVar11 = (cpi->common).mi_params.mi_rows - mi_row;
    if ((int)(uint)"\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"[bs]
        <= (int)uVar11) {
      uVar11 = (uint)"\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                     [bs];
    }
    iVar4 = pSVar5->mib_size;
    uVar7 = get_aq_c_strength((cpi->common).quant_params.base_qindex,pSVar5->bit_depth);
    if ((cpi->oxcf).pass < AOM_RC_LAST_PASS) {
      dVar15 = 10.0;
    }
    else {
      dVar14 = exp((cpi->twopass_frame).mb_av_energy);
      dVar15 = 8.0;
      if (8.0 < dVar14) {
        dVar15 = exp((cpi->twopass_frame).mb_av_energy);
      }
    }
    av1_setup_src_planes(mb,cpi->source,mi_row,mi_col,(uint)(uVar1 == '\0') * 2 + 1,bs);
    iVar8 = av1_log_block_var(cpi,mb,bs);
    local_40 = (int)(((long)(int)(iVar2 * uVar10 * uVar11) << 9) /
                    (long)(ulong)(uint)(iVar4 * iVar4));
    for (lVar9 = 0; lVar9 != 5; lVar9 = lVar9 + 1) {
      if (((double)projected_rate < aq_c_transitions[uVar7][lVar9] * (double)local_40) &&
         ((double)iVar8 < aq_c_var_thresholds[uVar7][lVar9] + dVar15)) goto LAB_0033c705;
    }
    lVar9 = 4;
LAB_0033c705:
    iVar2 = (cpi->common).mi_params.mi_cols;
    __s = (cpi->enc_seg).map + (iVar3 * mi_row + mi_col);
    uVar7 = 0;
    if (0 < (int)uVar11) {
      uVar7 = uVar11;
    }
    uVar12 = (ulong)uVar7;
    while (bVar13 = uVar12 != 0, uVar12 = uVar12 - 1, bVar13) {
      memset(__s,(uint)lVar9 & 0xff,(long)(int)uVar10);
      __s = __s + iVar2;
    }
  }
  return;
}

Assistant:

void av1_caq_select_segment(const AV1_COMP *cpi, MACROBLOCK *mb, BLOCK_SIZE bs,
                            int mi_row, int mi_col, int projected_rate) {
  if ((!is_frame_aq_enabled(cpi)) || (!is_sb_aq_enabled(cpi))) return;
  const AV1_COMMON *const cm = &cpi->common;
  const int num_planes = av1_num_planes(cm);

  const int mi_offset = mi_row * cm->mi_params.mi_cols + mi_col;
  const int xmis = AOMMIN(cm->mi_params.mi_cols - mi_col, mi_size_wide[bs]);
  const int ymis = AOMMIN(cm->mi_params.mi_rows - mi_row, mi_size_high[bs]);
  int i;
  unsigned char segment;

  // Rate depends on fraction of a SB64 in frame (xmis * ymis / bw * bh).
  // It is converted to bits << AV1_PROB_COST_SHIFT units.
  const int64_t num = (int64_t)(cpi->rc.sb64_target_rate * xmis * ymis)
                      << AV1_PROB_COST_SHIFT;
  const int denom = cm->seq_params->mib_size * cm->seq_params->mib_size;
  const int target_rate = (int)(num / denom);
  double logvar;
  double low_var_thresh;
  const int aq_strength = get_aq_c_strength(cm->quant_params.base_qindex,
                                            cm->seq_params->bit_depth);

  low_var_thresh =
      (is_stat_consumption_stage_twopass(cpi))
          ? AOMMAX(exp(cpi->twopass_frame.mb_av_energy), MIN_DEFAULT_LV_THRESH)
          : DEFAULT_LV_THRESH;

  av1_setup_src_planes(mb, cpi->source, mi_row, mi_col, num_planes, bs);
  logvar = av1_log_block_var(cpi, mb, bs);

  segment = AQ_C_SEGMENTS - 1;  // Just in case no break out below.
  for (i = 0; i < AQ_C_SEGMENTS; ++i) {
    // Test rate against a threshold value and variance against a threshold.
    // Increasing segment number (higher variance and complexity) = higher Q.
    if ((projected_rate < target_rate * aq_c_transitions[aq_strength][i]) &&
        (logvar < (low_var_thresh + aq_c_var_thresholds[aq_strength][i]))) {
      segment = i;
      break;
    }
  }

  // Fill in the entires in the segment map corresponding to this SB64.
  const int mi_stride = cm->mi_params.mi_cols;
  set_segment_id(cpi->enc_seg.map, mi_offset, xmis, ymis, mi_stride, segment);
}